

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

void __thiscall
gl4cts::anon_unknown_0::PIQBase::VerifyGetProgramResourceIndex
          (PIQBase *this,GLuint program,GLenum programInterface,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *indices,string *name,long *error)

{
  _Rb_tree_color _Var1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_color *p_Var3;
  ulong uVar4;
  char *format;
  
  _Var1 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
                     programInterface,(name->_M_dataplus)._M_p);
  if (_Var1 == ~_S_red) {
    format = "ERROR: Got %d, expected number other than -1\n";
    uVar4 = 0xffffffff;
LAB_008f1cf0:
    anon_unknown_0::Output(format,uVar4);
    *error = -1;
  }
  else {
    for (p_Var2 = (indices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(indices->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[2]._M_color == _Var1) {
        format = "ERROR: Duplicated value found: %d\n";
        uVar4 = (ulong)_Var1;
        goto LAB_008f1cf0;
      }
    }
    p_Var3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](indices,name);
    *p_Var3 = _Var1;
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceIndex(GLuint program, GLenum		 programInterface,
													  std::map<std::string, GLuint>& indices, const std::string& name,
													  long& error)
	{
		GLuint res = glGetProgramResourceIndex(program, programInterface, name.c_str());
		if (res == GL_INVALID_INDEX)
		{
			Output("ERROR: Got %d, expected number other than -1\n", res);
			error = ERROR;
			return;
		}
		std::map<std::string, GLuint>::iterator it = indices.begin();
		while (it != indices.end())
		{
			if (it->second == res)
			{
				Output("ERROR: Duplicated value found: %d\n", res);
				error = ERROR;
				return;
			}
			++it;
		}
		indices[name] = res;
	}